

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionAndResolution.cpp
# Opt level: O3

void __thiscall
Inferences::BackwardSubsumptionAndResolution::perform
          (BackwardSubsumptionAndResolution *this,Clause *cl,
          BwSimplificationRecordIterator *simplifications)

{
  int *piVar1;
  long *plVar2;
  DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  LiteralIndexingStructure<Indexing::LiteralClause> *pLVar3;
  _func_int *p_Var4;
  Clause *pCVar5;
  BackwardSubsumptionAndResolution *pBVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  void **head;
  _func_int **pp_Var10;
  Clause *pCVar11;
  FixedSizeAllocator<24UL> *pFVar12;
  uint uVar13;
  ulong uVar14;
  SATSubsumptionAndResolution *pSVar15;
  uint uVar16;
  long lVar17;
  Literal *pLVar18;
  bool setSR;
  _func_int **pp_Var19;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> res;
  long *local_80;
  FixedSizeAllocator<24UL> *local_78;
  VirtualIterator<Inferences::BwSimplificationRecord> local_70;
  int *local_68;
  undefined8 *local_60;
  BackwardSubsumptionAndResolution *local_58;
  Clause *local_50;
  SATSubsumptionAndResolution *local_48;
  FixedSizeAllocator<24UL> *local_40;
  BwSimplificationRecordIterator *local_38;
  
  local_50 = cl;
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::getEmpty();
  local_38 = simplifications;
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=(simplifications,&local_70);
  if (local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) {
    piVar1 = &(local_70._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_70._core)->_vptr_IteratorCore[1])();
    }
  }
  pCVar5 = local_50;
  if ((this->_subsumption == false) && (this->_subsumptionResolution != true)) {
    return;
  }
  this_00 = &this->_checked;
  Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&this_00->_map);
  uVar16 = *(uint *)&pCVar5->field_0x38 & 0xfffff;
  local_58 = this;
  if (uVar16 == 1) {
    pSVar15 = (SATSubsumptionAndResolution *)pCVar5->_literals[0];
    if (this->_subsumption == true) {
      pLVar3 = (this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
               super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               .
               super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
               ._M_head_impl;
      local_48 = pSVar15;
      (*pLVar3->_vptr_LiteralIndexingStructure[7])(&local_80,pLVar3,pSVar15,0,0);
      local_78 = (FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30);
      pp_Var19 = (_func_int **)0x0;
      while (cVar7 = (**(code **)(*local_80 + 0x10))(), cVar7 != '\0') {
        (**(code **)(*local_80 + 0x18))(&local_70);
        p_Var4 = (_func_int *)local_60[1];
        if (((local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) &&
            (local_68 != (int *)0x0)) &&
           ((*local_68 = *local_68 + -1, *local_68 == 0 &&
            ((*(local_70._core)->_vptr_IteratorCore[1])(), local_68 != (int *)0x0)))) {
          *(undefined8 *)local_68 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68;
        }
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map,p_Var4);
        if (bVar8) {
          *(int *)(DAT_00b521c0 + 0x1b8) = *(int *)(DAT_00b521c0 + 0x1b8) + 1;
          pp_Var10 = (_func_int **)Lib::FixedSizeAllocator<24UL>::alloc(local_78);
          *pp_Var10 = p_Var4;
          pp_Var10[1] = (_func_int *)0x0;
          pp_Var10[2] = (_func_int *)pp_Var19;
          pp_Var19 = pp_Var10;
        }
      }
      pSVar15 = local_48;
      if (local_80 != (long *)0x0) {
        plVar2 = local_80 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_80 + 8))();
          pSVar15 = local_48;
        }
      }
    }
    else {
      pp_Var19 = (_func_int **)0x0;
    }
    if (local_58->_subsumptionResolution == true) {
      pLVar3 = (local_58->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
               super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               .
               super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
               ._M_head_impl;
      (*pLVar3->_vptr_LiteralIndexingStructure[7])(&local_80,pLVar3,pSVar15,1,0);
      while (cVar7 = (**(code **)(*local_80 + 0x10))(), cVar7 != '\0') {
        (**(code **)(*local_80 + 0x18))(&local_70);
        pCVar5 = (Clause *)local_60[1];
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map,pCVar5);
        pp_Var10 = pp_Var19;
        if (bVar8) {
          pCVar11 = SATSubsumption::SATSubsumptionAndResolution::getSubsumptionResolutionConclusion
                              (pCVar5,(Literal *)*local_60,local_50);
          *(int *)(DAT_00b521c0 + 0x144) = *(int *)(DAT_00b521c0 + 0x144) + 1;
          pp_Var10 = (_func_int **)
                     Lib::FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
          *pp_Var10 = (_func_int *)pCVar5;
          pp_Var10[1] = (_func_int *)pCVar11;
          pp_Var10[2] = (_func_int *)pp_Var19;
        }
        pp_Var19 = pp_Var10;
        if (((local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) &&
            (local_68 != (int *)0x0)) && (*local_68 = *local_68 + -1, *local_68 == 0)) {
          (*(local_70._core)->_vptr_IteratorCore[1])();
          if (local_68 != (int *)0x0) {
            *(undefined8 *)local_68 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68;
          }
        }
      }
      if (local_80 != (long *)0x0) {
        plVar2 = local_80 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_80 + 8))();
        }
      }
    }
    if (pp_Var19 == (_func_int **)0x0) {
      return;
    }
    local_70._core =
         (IteratorCore<Inferences::BwSimplificationRecord> *)
         Lib::FixedSizeAllocator<24UL>::alloc
                   ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    (local_70._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b37260;
    local_70._core[1]._vptr_IteratorCore = pp_Var19;
  }
  else {
    if ((this->_subsumptionByUnitsOnly == true) && (this->_srByUnitsOnly != false)) {
      return;
    }
    pLVar18 = pCVar5->_literals[0];
    if (uVar16 != 0) {
      uVar13 = (pLVar18->super_Term)._weight;
      uVar14 = 2;
      if (2 < uVar16) {
        uVar14 = (ulong)uVar16;
      }
      lVar17 = 0;
      do {
        uVar16 = (pCVar5[1]._literals[lVar17 + -0xe]->super_Term)._weight;
        if (uVar13 < uVar16) {
          pLVar18 = pCVar5[1]._literals[lVar17 + -0xe];
          uVar13 = uVar16;
        }
        lVar17 = lVar17 + 1;
      } while (uVar14 - 1 != lVar17);
    }
    if (this->_subsumptionByUnitsOnly == false) {
      pLVar3 = (this->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
               super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               .
               super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
               ._M_head_impl;
      local_78 = (FixedSizeAllocator<24UL> *)0x0;
      (*pLVar3->_vptr_LiteralIndexingStructure[7])(&local_80,pLVar3,pLVar18,0,0);
      local_48 = &this->_satSubs;
      local_40 = (FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30);
LAB_004a8597:
      cVar7 = (**(code **)(*local_80 + 0x10))();
      if (cVar7 != '\0') {
        (**(code **)(*local_80 + 0x18))(&local_70);
        pCVar5 = (Clause *)local_60[1];
        if ((((local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) &&
             (local_68 != (int *)0x0)) && (*local_68 = *local_68 + -1, *local_68 == 0)) &&
           ((*(local_70._core)->_vptr_IteratorCore[1])(), local_68 != (int *)0x0)) {
          *(undefined8 *)local_68 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68;
        }
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map,pCVar5);
        if (bVar8) {
          bVar8 = (bool)((local_58->_subsumptionByUnitsOnly ^ 1U) & local_58->_subsumption);
          setSR = (bool)((local_58->_srByUnitsOnly ^ 1U) & local_58->_subsumptionResolution);
          if ((bVar8 == true) &&
             (bVar9 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumption
                                (local_48,local_50,pCVar5,setSR), bVar9)) {
            *(int *)(DAT_00b521c0 + 0x1b8) = *(int *)(DAT_00b521c0 + 0x1b8) + 1;
            pFVar12 = (FixedSizeAllocator<24UL> *)Lib::FixedSizeAllocator<24UL>::alloc(local_40);
            pCVar11 = (Clause *)0x0;
          }
          else {
            if ((setSR == false) ||
               (pCVar11 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                                    (local_48,local_50,pCVar5,bVar8), pCVar11 == (Clause *)0x0))
            goto LAB_004a8597;
            *(int *)(DAT_00b521c0 + 0x144) = *(int *)(DAT_00b521c0 + 0x144) + 1;
            pFVar12 = (FixedSizeAllocator<24UL> *)Lib::FixedSizeAllocator<24UL>::alloc(local_40);
          }
          (pFVar12->current).bytes = (char *)pCVar5;
          (pFVar12->current).remaining = (size_t)pCVar11;
          pFVar12->free_list = (void **)local_78;
          local_78 = pFVar12;
        }
        goto LAB_004a8597;
      }
      if (local_80 != (long *)0x0) {
        plVar2 = local_80 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_80 + 8))();
        }
      }
    }
    else {
      local_78 = (FixedSizeAllocator<24UL> *)0x0;
    }
    pBVar6 = local_58;
    if ((local_58->_subsumptionResolution == true) && (local_58->_srByUnitsOnly == false)) {
      pLVar3 = (local_58->_bwIndex->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
               super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
               .
               super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>
               ._M_head_impl;
      (*pLVar3->_vptr_LiteralIndexingStructure[7])(&local_80,pLVar3,pLVar18,1,0);
      local_58 = (BackwardSubsumptionAndResolution *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30);
      while (cVar7 = (**(code **)(*local_80 + 0x10))(), cVar7 != '\0') {
        (**(code **)(*local_80 + 0x18))(&local_70);
        pCVar5 = (Clause *)local_60[1];
        if ((((local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) &&
             (local_68 != (int *)0x0)) && (*local_68 = *local_68 + -1, *local_68 == 0)) &&
           ((*(local_70._core)->_vptr_IteratorCore[1])(), local_68 != (int *)0x0)) {
          *(undefined8 *)local_68 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68;
        }
        bVar8 = Lib::DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this_00->_map,pCVar5);
        if ((bVar8) &&
           (pCVar11 = SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                                (&pBVar6->_satSubs,local_50,pCVar5,false), pCVar11 != (Clause *)0x0)
           ) {
          *(int *)(DAT_00b521c0 + 0x144) = *(int *)(DAT_00b521c0 + 0x144) + 1;
          pFVar12 = (FixedSizeAllocator<24UL> *)
                    Lib::FixedSizeAllocator<24UL>::alloc((FixedSizeAllocator<24UL> *)local_58);
          (pFVar12->current).bytes = (char *)pCVar5;
          (pFVar12->current).remaining = (size_t)pCVar11;
          pFVar12->free_list = (void **)local_78;
          local_78 = pFVar12;
        }
      }
      if (local_80 != (long *)0x0) {
        plVar2 = local_80 + 1;
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*local_80 + 8))();
        }
      }
    }
    pFVar12 = local_78;
    if (local_78 == (FixedSizeAllocator<24UL> *)0x0) {
      return;
    }
    local_70._core =
         (IteratorCore<Inferences::BwSimplificationRecord> *)
         Lib::FixedSizeAllocator<24UL>::alloc
                   ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    (local_70._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b37260;
    local_70._core[1]._vptr_IteratorCore = (_func_int **)pFVar12;
  }
  (local_70._core)->_refCnt = 1;
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=(local_38,&local_70);
  if (local_70._core != (IteratorCore<Inferences::BwSimplificationRecord> *)0x0) {
    piVar1 = &(local_70._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_70._core)->_vptr_IteratorCore[1])();
    }
  }
  return;
}

Assistant:

void BackwardSubsumptionAndResolution::perform(Clause *cl,
                                               BwSimplificationRecordIterator &simplifications)
{
  ASSERT_VALID(*cl)
  ASS(_bwIndex)
  simplifications = BwSimplificationRecordIterator::getEmpty();

  if (!_subsumption && !_subsumptionResolution) {
    return;
  }

  _checked.reset();

  // contains the list of simplifications found so far
  List<BwSimplificationRecord> *simplificationBuffer = List<BwSimplificationRecord>::empty();

  /********************************************************/
  /*                      cl is UNIT                      */
  /********************************************************/
  // cl is a unit clause and will subsume all clauses that contain its literal
  // and will be resolved with all clauses that contain its negation
  if (cl->length() == 1) {
    Literal *lit = (*cl)[0];
    // Check for the subsumptions
    if (_subsumption) {
      /***************************************************/
      /*            SUBSUMPTION UNIT CLAUSE              */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, false, false);
      while (it.hasNext()) {
        Clause *icl = it.next().data->clause;
        if (!_checked.insert(icl))
          continue;
        env.statistics->backwardSubsumed++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
      }
    }
    if (_subsumptionResolution) {
      /***************************************************/
      /*      SUBSUMPTION RESOLUTION UNIT CLAUSE         */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, true, false);
      while (it.hasNext()) {
        auto res = it.next();
        Clause *icl = res.data->clause;
        if (!_checked.insert(icl))
          continue;
        Clause *conclusion = SATSubsumption::SATSubsumptionAndResolution::getSubsumptionResolutionConclusion(icl, res.data->literal, cl);
        ASS(conclusion)
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  if (_subsumptionByUnitsOnly && _srByUnitsOnly) {
    ASS(!simplificationBuffer)
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  /*******************************************************/
  /*       SUBSUMPTION & RESOLUTION MULTI-LITERAL        */
  /*******************************************************/
  // We use the optimization from Krystof Hoder and only search the instances of the least matchable
  // literal. Indeed, since for subsumption and subsumption resolution, each literal in the subsuming
  // clause S must be matched at least one literal in the subsumed clause M (idem for SR).
  // Therefore checking the instances of the least matchable literal will limit the number of candidates
  // for both subsumption and subsumption resolution.
  // For now, the least matchable literal is the heaviest literal in the clause. But this heuristic
  // could probably be improved.
  Literal* lit = (*cl)[0];
  unsigned lmVal = lit->weight();
  for(unsigned i = 1; i < cl->length(); i++) {
    Literal* curr = (*cl)[i];
    unsigned currVal = curr->weight();
    if(currVal > lmVal) {
      lit = curr;
      lmVal = currVal;
    }
  }

  if (!_subsumptionByUnitsOnly) {
    // find the positively matched literals
    auto it = _bwIndex->getInstances(lit, false, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption and setup subsumption resolution at the same time
      bool checkS = _subsumption && !_subsumptionByUnitsOnly;
      bool checkSR = _subsumptionResolution && !_srByUnitsOnly;
      if (checkS) {
        if (_satSubs.checkSubsumption(cl, icl, checkSR)) {
          env.statistics->backwardSubsumed++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
          continue;
        }
      }
      if (checkSR) {
        // check subsumption resolution
        Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, checkS); // use the previous setup only if subsumption was checked
        if (conclusion) {
          env.statistics->backwardSubsumptionResolution++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
        }
      }
    }
  }

  /*******************************************************/
  /*       SUBSUMPTION RESOLUTION MULTI-LITERAL          */
  /*******************************************************/
  if (_subsumptionResolution && !_srByUnitsOnly) {
    // find the negatively matched literals
    // We can use the same least matchable literal as before since our method is agnostic to the
    // flipped literal
    auto it = _bwIndex->getInstances(lit, true, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption resolution
      Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, false);
      if (conclusion) {
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
  }

  if (simplificationBuffer) {
    simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
  }
}